

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O0

void __thiscall
duckdb_shell::ModeAsciiRenderer::RenderRow(ModeAsciiRenderer *this,RowResult *result)

{
  ShellState *pSVar1;
  long in_RSI;
  char *in_RDI;
  idx_t i;
  vector<const_char_*,_std::allocator<const_char_*>_> *data;
  string *in_stack_ffffffffffffffc8;
  ShellState *this_00;
  ShellState *this_01;
  
  this_00 = (ShellState *)0x0;
  while( true ) {
    this_01 = this_00;
    pSVar1 = (ShellState *)
             std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                       ((vector<const_char_*,_std::allocator<const_char_*>_> *)(in_RSI + 0x18));
    if (pSVar1 <= this_00) break;
    if (this_01 != (ShellState *)0x0) {
      ShellState::Print(this_00,in_stack_ffffffffffffffc8);
    }
    in_stack_ffffffffffffffc8 = *(string **)(in_RDI + 8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)(in_RSI + 0x18),
               (size_type)this_01);
    ShellState::PrintValue(this_01,in_RDI);
    this_00 = (ShellState *)((long)&this_01->db + 1);
  }
  ShellState::Print(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void RenderRow(RowResult &result) override {
		auto &data = result.data;
		for (idx_t i = 0; i < data.size(); i++) {
			if (i > 0) {
				state.Print(col_sep);
			}
			state.PrintValue(data[i]);
		}
		state.Print(row_sep);
	}